

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O0

Vec_Int_t * Saig_RefManRefineWithSat(Saig_RefMan_t *p,Vec_Int_t *vAigPis)

{
  long lVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  int iVar4;
  lit Entry_00;
  uint uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *piVar8;
  int *piVar9;
  Saig_RefMan_t *p_02;
  char *pcVar10;
  int iPiNum;
  int iFrame;
  int iInput;
  int Counter;
  int RetValue;
  int Entry;
  int f;
  int k;
  int i;
  Vec_Int_t *vVar2PiId;
  Vec_Int_t *vVisited;
  Vec_Int_t *vAssumps;
  Vec_Int_t *vReasons;
  Vec_Vec_t *vLits;
  Aig_Obj_t *pObj;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Vec_Int_t *pVStack_20;
  int nConfLimit;
  Vec_Int_t *vAigPis_local;
  Saig_RefMan_t *p_local;
  
  pCnf._4_4_ = 1000000;
  pVStack_20 = vAigPis;
  vAigPis_local = (Vec_Int_t *)p;
  pSat = (sat_solver *)Cnf_DeriveSimple(p->pFrames,0);
  pObj = (Aig_Obj_t *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)pSat,1,0);
  if (pObj == (Aig_Obj_t *)0x0) {
    Cnf_DataFree((Cnf_Dat_t *)pSat);
    p_local = (Saig_RefMan_t *)0x0;
  }
  else {
    iVar3 = Saig_ManPiNum(*(Aig_Man_t **)vAigPis_local);
    pVVar7 = Vec_IntStart(iVar3);
    for (f = 0; iVar3 = Vec_IntSize(pVStack_20), f < iVar3; f = f + 1) {
      iVar3 = Vec_IntEntry(pVStack_20,f);
      if ((iVar3 < 0) || (iVar6 = Aig_ManCiNum(*(Aig_Man_t **)vAigPis_local), iVar6 <= iVar3)) {
        __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(p->pAig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                      ,0x2d9,"Vec_Int_t *Saig_RefManRefineWithSat(Saig_RefMan_t *, Vec_Int_t *)");
      }
      Vec_IntWriteEntry(pVVar7,iVar3,1);
    }
    p_00 = Vec_IntStartFull(pSat->qhead);
    iVar3 = Aig_ManCiNum((Aig_Man_t *)vAigPis_local[1].pArray);
    p_01 = Vec_IntAlloc(iVar3);
    for (f = 0; iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)(vAigPis_local[1].pArray + 4)), f < iVar3;
        f = f + 1) {
      vLits = (Vec_Vec_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vAigPis_local[1].pArray + 4),f);
      iVar3 = Vec_IntEntry(*(Vec_Int_t **)(vAigPis_local + 2),f << 1);
      iVar6 = Vec_IntEntry(*(Vec_Int_t **)(vAigPis_local + 2),f * 2 + 1);
      iVar4 = Vec_IntEntry(pVVar7,iVar3);
      if (iVar4 != 0) {
        iVar3 = Abc_InfoHasBit((uint *)(vAigPis_local->pArray + 5),
                               vAigPis_local->pArray[2] + vAigPis_local->pArray[3] * iVar6 + iVar3);
        lVar1 = *(long *)(pSat->Mem).BookMarkE;
        iVar6 = Aig_ObjId((Aig_Obj_t *)vLits);
        Entry_00 = toLitCond(*(int *)(lVar1 + (long)iVar6 * 4),(uint)((iVar3 != 0 ^ 0xffU) & 1));
        Vec_IntPush(p_01,Entry_00);
        lVar1 = *(long *)(pSat->Mem).BookMarkE;
        iVar3 = Aig_ObjId((Aig_Obj_t *)vLits);
        Vec_IntWriteEntry(p_00,*(int *)(lVar1 + (long)iVar3 * 4),f);
      }
    }
    Vec_IntFree(pVVar7);
    pAVar2 = pObj;
    piVar8 = Vec_IntArray(p_01);
    piVar9 = Vec_IntArray(p_01);
    iVar3 = Vec_IntSize(p_01);
    iVar3 = sat_solver_solve((sat_solver *)pAVar2,piVar8,piVar9 + iVar3,(long)pCnf._4_4_,0,0,0);
    uVar5 = Vec_IntSize(p_01);
    pcVar10 = "SAT";
    if (iVar3 == -1) {
      pcVar10 = "UNSAT";
    }
    printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar5,pcVar10,
           (ulong)pObj[8].pFanin1 & 0xffffffff);
    vReasons = (Vec_Int_t *)Saig_RefManOrderLiterals((Saig_RefMan_t *)vAigPis_local,p_00,p_01);
    for (f = 0; iVar3 = Vec_VecSize((Vec_Vec_t *)vReasons), f < iVar3; f = f + 1) {
      pVVar7 = Vec_VecEntryInt((Vec_Vec_t *)vReasons,f);
      uVar5 = Vec_IntSize(pVVar7);
      printf("%d ",(ulong)uVar5);
    }
    printf("\n");
    Vec_VecSize((Vec_Vec_t *)vReasons);
    for (RetValue = 0; iVar3 = Vec_VecSize((Vec_Vec_t *)vReasons), RetValue < iVar3;
        RetValue = RetValue + 1) {
      Vec_IntClear(p_01);
      for (f = 0; iVar3 = Vec_VecSize((Vec_Vec_t *)vReasons), pAVar2 = pObj, f < iVar3; f = f + 1) {
        Entry = 0;
        while( true ) {
          pVVar7 = Vec_VecEntryInt((Vec_Vec_t *)vReasons,f);
          iVar3 = Vec_IntSize(pVVar7);
          if (iVar3 <= Entry) break;
          pVVar7 = Vec_VecEntryInt((Vec_Vec_t *)vReasons,f);
          iVar3 = Vec_IntEntry(pVVar7,Entry);
          if (f != RetValue) {
            Vec_IntPush(p_01,iVar3);
          }
          Entry = Entry + 1;
        }
      }
      piVar8 = Vec_IntArray(p_01);
      piVar9 = Vec_IntArray(p_01);
      iVar3 = Vec_IntSize(p_01);
      iVar3 = sat_solver_solve((sat_solver *)pAVar2,piVar8,piVar9 + iVar3,(long)pCnf._4_4_,0,0,0);
      uVar5 = Vec_IntSize(p_01);
      pcVar10 = "SAT";
      if (iVar3 == -1) {
        pcVar10 = "UNSAT";
      }
      printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar5,pcVar10
             ,(ulong)pObj[8].pFanin1 & 0xffffffff);
      if (iVar3 == -1) {
        pVVar7 = Vec_VecEntryInt((Vec_Vec_t *)vReasons,RetValue);
        Vec_IntClear(pVVar7);
      }
    }
    for (f = 0; iVar3 = Vec_VecSize((Vec_Vec_t *)vReasons), f < iVar3; f = f + 1) {
      pVVar7 = Vec_VecEntryInt((Vec_Vec_t *)vReasons,f);
      uVar5 = Vec_IntSize(pVVar7);
      printf("%d ",(ulong)uVar5);
    }
    printf("\n");
    Vec_IntClear(p_01);
    for (f = 0; iVar3 = Vec_VecSize((Vec_Vec_t *)vReasons), pAVar2 = pObj, f < iVar3; f = f + 1) {
      Entry = 0;
      while( true ) {
        pVVar7 = Vec_VecEntryInt((Vec_Vec_t *)vReasons,f);
        iVar3 = Vec_IntSize(pVVar7);
        if (iVar3 <= Entry) break;
        pVVar7 = Vec_VecEntryInt((Vec_Vec_t *)vReasons,f);
        iVar3 = Vec_IntEntry(pVVar7,Entry);
        Vec_IntPush(p_01,iVar3);
        Entry = Entry + 1;
      }
    }
    piVar8 = Vec_IntArray(p_01);
    piVar9 = Vec_IntArray(p_01);
    iVar3 = Vec_IntSize(p_01);
    iVar3 = sat_solver_solve((sat_solver *)pAVar2,piVar8,piVar9 + iVar3,(long)pCnf._4_4_,0,0,0);
    uVar5 = Vec_IntSize(p_01);
    pcVar10 = "SAT";
    if (iVar3 == -1) {
      pcVar10 = "UNSAT";
    }
    printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar5,pcVar10,
           (ulong)pObj[8].pFanin1 & 0xffffffff);
    p_02 = (Saig_RefMan_t *)Vec_IntAlloc(100);
    for (f = 0; iVar3 = Vec_IntSize(p_01), f < iVar3; f = f + 1) {
      iVar3 = Vec_IntEntry(p_01,f);
      iVar3 = lit_var(iVar3);
      iVar3 = Vec_IntEntry(p_00,iVar3);
      if ((iVar3 < 0) ||
         (iVar6 = Aig_ManCiNum((Aig_Man_t *)vAigPis_local[1].pArray), iVar6 <= iVar3)) {
        __assert_fail("iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                      ,0x347,"Vec_Int_t *Saig_RefManRefineWithSat(Saig_RefMan_t *, Vec_Int_t *)");
      }
      Vec_IntPush((Vec_Int_t *)p_02,iVar3);
    }
    Cnf_DataFree((Cnf_Dat_t *)pSat);
    sat_solver_delete((sat_solver *)pObj);
    Vec_IntFree(p_01);
    Vec_IntFree(p_00);
    Vec_VecFreeP((Vec_Vec_t **)&vReasons);
    p_local = p_02;
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Saig_RefManRefineWithSat( Saig_RefMan_t * p, Vec_Int_t * vAigPis )
{
    int nConfLimit = 1000000;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLits;
    Vec_Int_t * vReasons, * vAssumps, * vVisited, * vVar2PiId;
    int i, k, f, Entry, RetValue, Counter;

    // create CNF and SAT solver
    pCnf = Cnf_DeriveSimple( p->pFrames, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }

    // mark used AIG inputs
    vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vAigPis, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(p->pAig) );
        Vec_IntWriteEntry( vVisited, Entry, 1 );
    }

    // create assumptions
    vVar2PiId = Vec_IntStartFull( pCnf->nVars );
    vAssumps = Vec_IntAlloc( Aig_ManCiNum(p->pFrames) );
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        if ( Vec_IntEntry(vVisited, iInput) == 0 )
            continue;
        RetValue = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !RetValue ) );
//        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 ) );
        Vec_IntWriteEntry( vVar2PiId, pCnf->pVarNums[Aig_ObjId(pObj)], i );
    }
    Vec_IntFree( vVisited );

    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

/*
    // AnalizeFinal does not work because it implications propagate directly
    // and SAT solver does not kick in (the number of conflicts in 0).

    // count the number of lits in the unsat core
    {
        int nCoreLits, * pCoreLits;
        nCoreLits = sat_solver_final( pSat, &pCoreLits );
        assert( nCoreLits > 0 );

        // count the number of flops
        vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
        for ( i = 0; i < nCoreLits; i++ )
        {
            int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(pCoreLits[i]) );
            int iInput = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum );
            int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum+1 );
            Vec_IntWriteEntry( vVisited, iInput, 1 );
        }
        // count the number of entries
        Counter = 0;
        Vec_IntForEachEntry( vVisited, Entry, i )
            Counter += Entry;
        Vec_IntFree( vVisited );

//        if ( p->fVerbose )
        printf( "AnalizeFinal: Assumptions %d (out of %d). Essential PIs = %d. Conflicts = %d.\n", 
            nCoreLits, Vec_IntSize(vAssumps), Counter, (int)pSat->stats.conflicts );
    }
*/

    // derive literals
    vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    // create different sets of assumptions
    Counter = Vec_VecSize(vLits);
    for ( f = 0; f < Vec_VecSize(vLits); f++ )
    {
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            if ( i != f )
                Vec_IntPush( vAssumps, Entry );

        // try the new assumptions
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
            Vec_IntSize(vAssumps), RetValue == l_False ? "UNSAT" : "SAT", (int)pSat->stats.conflicts );
        if ( RetValue != l_False )
            continue;

        // UNSAT - remove literals
        Vec_IntClear( Vec_VecEntryInt(vLits, f) );
        Counter--;
    }

    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    // create assumptions
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );

    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

//    if ( p->fVerbose )
//        printf( "Total PIs = %d. Essential PIs = %d.\n", 
//            Saig_ManPiNum(p->pAig) - p->nInputs, Counter );


    // transform assumptions into reasons
    vReasons = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vAssumps, Entry, i )
    {
        int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(Entry) );
        assert( iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames) );
        Vec_IntPush( vReasons, iPiNum );
    }

    // cleanup
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_IntFree( vAssumps );
    Vec_IntFree( vVar2PiId );
    Vec_VecFreeP( &vLits );

    return vReasons;
}